

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

void __thiscall Game::setRegularTeams(Game *this)

{
  pointer pvVar1;
  pointer pCVar2;
  __normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_> _Var3;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  ulong __n;
  reference rVar7;
  vector<Card,_std::allocator<Card>_> local_50;
  undefined8 local_38;
  
  lVar6 = 0;
  __n = 0;
  do {
    pvVar1 = (this->m_playerCards).
             super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->m_playerCards).
                   super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            -0x5555555555555555;
    if (uVar5 < __n || uVar5 - __n == 0) {
      uVar4 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,__n);
      if (local_50.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar4);
    }
    std::vector<Card,_std::allocator<Card>_>::vector
              (&local_50,
               (vector<Card,_std::allocator<Card>_> *)
               ((long)&(pvVar1->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
                       super__Vector_impl_data + lVar6));
    local_38 = 0x200000003;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__ops::_Iter_equals_val<Card_const>>
                      (local_50.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_50.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_38);
    pCVar2 = local_50.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_50.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (_Var3._M_current != pCVar2) {
      rVar7 = std::vector<bool,_std::allocator<bool>_>::at(&this->m_teams,__n);
      *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
    }
    __n = __n + 1;
    lVar6 = lVar6 + 0x18;
  } while (__n != 4);
  return;
}

Assistant:

void Game::setRegularTeams() {
    //regular rules:
    for (size_t i = 0; i < NUMPLAYERS; i++) {
        if (contains(m_playerCards.at(i), Card(Suit::CLUBS, CardValue::QUEEN)))
            m_teams.at(i) = true;
    }
}